

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.cpp
# Opt level: O0

void __thiscall
Assimp::LWSImporter::ReadEnvelope_Old
          (LWSImporter *this,const_iterator *it,const_iterator *end,NodeDesc *nodes,uint param_4)

{
  bool bVar1;
  _Self *p_Var2;
  char *pcVar3;
  list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *this_00;
  reference pvVar4;
  Logger *this_01;
  float local_c4;
  char *pcStack_c0;
  float f;
  char *c;
  Key key;
  uint n;
  Envelope *envl;
  Envelope local_70;
  uint local_38;
  uint local_34;
  uint i;
  uint sub_num;
  uint num;
  uint param_4_local;
  NodeDesc *nodes_local;
  const_iterator *end_local;
  const_iterator *it_local;
  LWSImporter *this_local;
  
  sub_num = param_4;
  _num = nodes;
  nodes_local = (NodeDesc *)end;
  end_local = it;
  it_local = (const_iterator *)this;
  p_Var2 = std::_List_const_iterator<Assimp::LWS::Element>::operator++(it);
  bVar1 = std::operator==(p_Var2,(_Self *)nodes_local);
  if (bVar1) {
LAB_006809b4:
    this_01 = DefaultLogger::get();
    Logger::error(this_01,"LWS: Encountered unexpected end of file while parsing object motion");
  }
  else {
    std::_List_const_iterator<Assimp::LWS::Element>::operator*(end_local);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    i = strtoul10(pcVar3,(char **)0x0);
    for (local_38 = 0; local_38 < i; local_38 = local_38 + 1) {
      this_00 = &_num->channels;
      LWO::Envelope::Envelope(&local_70);
      std::__cxx11::list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::push_back
                (this_00,&local_70);
      LWO::Envelope::~Envelope(&local_70);
      pvVar4 = std::__cxx11::list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::
               back(&_num->channels);
      pvVar4->index = local_38;
      pvVar4->type = local_38 + EnvelopeType_Position_X;
      p_Var2 = std::_List_const_iterator<Assimp::LWS::Element>::operator++(end_local);
      bVar1 = std::operator==(p_Var2,(_Self *)nodes_local);
      if (bVar1) goto LAB_006809b4;
      std::_List_const_iterator<Assimp::LWS::Element>::operator*(end_local);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      local_34 = strtoul10(pcVar3,(char **)0x0);
      for (key._36_4_ = 0; (uint)key._36_4_ < local_34; key._36_4_ = key._36_4_ + 1) {
        p_Var2 = std::_List_const_iterator<Assimp::LWS::Element>::operator++(end_local);
        bVar1 = std::operator==(p_Var2,(_Self *)nodes_local);
        if (bVar1) goto LAB_006809b4;
        LWO::Key::Key((Key *)&c);
        std::_List_const_iterator<Assimp::LWS::Element>::operator*(end_local);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        pcStack_c0 = fast_atoreal_move<float>(pcVar3,(float *)&key,true);
        SkipSpaces<char>(&stack0xffffffffffffff40);
        std::_List_const_iterator<Assimp::LWS::Element>::operator*(end_local);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        fast_atoreal_move<float>(pcVar3,&local_c4,true);
        c = (char *)(double)local_c4;
        std::vector<Assimp::LWO::Key,_std::allocator<Assimp::LWO::Key>_>::push_back
                  (&pvVar4->keys,(value_type *)&c);
      }
    }
  }
  return;
}

Assistant:

void LWSImporter::ReadEnvelope_Old(
    std::list< LWS::Element >::const_iterator& it,
    const std::list< LWS::Element >::const_iterator& end,
    LWS::NodeDesc& nodes,
    unsigned int /*version*/)
{
    unsigned int num,sub_num;
    if (++it == end)goto unexpected_end;

    num = strtoul10((*it).tokens[0].c_str());
    for (unsigned int i = 0; i < num; ++i) {

        nodes.channels.push_back(LWO::Envelope());
        LWO::Envelope& envl = nodes.channels.back();

        envl.index = i;
        envl.type  = (LWO::EnvelopeType)(i+1);

        if (++it == end)goto unexpected_end;
        sub_num = strtoul10((*it).tokens[0].c_str());

        for (unsigned int n = 0; n < sub_num;++n) {

            if (++it == end)goto unexpected_end;

            // parse value and time, skip the rest for the moment.
            LWO::Key key;
            const char* c = fast_atoreal_move<float>((*it).tokens[0].c_str(),key.value);
            SkipSpaces(&c);
            float f;
            fast_atoreal_move<float>((*it).tokens[0].c_str(),f);
            key.time = f;

            envl.keys.push_back(key);
        }
    }
    return;

unexpected_end:
    ASSIMP_LOG_ERROR("LWS: Encountered unexpected end of file while parsing object motion");
}